

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrDEC0xd6(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  
  addr = this->PC;
  this->PC = addr + 1;
  uVar1 = Memory::Read8(this->m,addr);
  bVar2 = uVar1 + this->X;
  this_00 = this->m;
  uVar1 = Memory::Read8(this_00,(ushort)bVar2);
  uVar1 = uVar1 + 0xff;
  if (uVar1 == '\0') {
    bVar3 = this->field_0x2e | 0x40;
  }
  else {
    bVar3 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar3 = bVar3 | 1;
      goto LAB_0010f144;
    }
  }
  bVar3 = bVar3 & 0xfe;
LAB_0010f144:
  this->field_0x2e = bVar3;
  Memory::Write8(this_00,(ushort)bVar2,uVar1);
  return 6;
}

Assistant:

int CPU::instrDEC0xd6() {
	uint16_t address = zeropage_x_addr_j();
	m->Write8(address, DEC(m->Read8(address)));
	return 6;
}